

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_search.hpp
# Opt level: O1

search_result * __thiscall
cvs_rk::local_search::run_fixed_n_all_neighbors
          (search_result *__return_storage_ptr__,local_search *this,
          vector<bool,_std::allocator<bool>_> *initial_solution)

{
  ulong *puVar1;
  undefined8 uVar2;
  search_result *psVar3;
  ulong uVar4;
  iterator iVar5;
  ostream *poVar6;
  pointer pvVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  pointer pmVar14;
  double dVar15;
  set<cvs_rk::mod_int<9223372036854775783UL>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_nicolaprezza[P]cvs_rk_internal_local_search_hpp:160:15),_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  distinct_rows;
  candidate_t C;
  vector<bool,_std::allocator<bool>_> B;
  mod_int<9223372036854775783UL> c;
  candidate_t best_C;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  new_vec;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  sum;
  double local_280;
  double local_278;
  undefined1 local_268 [48];
  pointer pmStack_238;
  pointer pmStack_230;
  undefined1 local_228 [8];
  pointer pmStack_220;
  pointer local_218;
  uint local_210;
  _Bit_pointer local_208;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  local_200;
  double local_1e0;
  long local_1d8;
  vector<bool,_std::allocator<bool>_> local_1d0;
  search_result *local_1a8;
  double local_1a0;
  _Rb_tree<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>,std::_Identity<std::vector<bool,std::allocator<bool>>>,std::less<std::vector<bool,std::allocator<bool>>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
  *local_198;
  ulong local_190;
  pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
  local_188;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  local_148;
  pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
  local_128;
  ulong local_e8;
  long local_e0;
  _Base_ptr local_d8;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  local_d0;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  local_b8;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  local_a0;
  vector<bool,_std::allocator<bool>_> local_88;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  local_60;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  local_48;
  
  std::vector<bool,_std::allocator<bool>_>::vector(&local_88,initial_solution);
  if (local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  matrix<cvs_rk::rk_function<9223372036854775783UL>_>::hashed_rows(&local_148,&this->M);
  pvVar7 = (this->M).columns.
           super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->M).columns.
      super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar7) {
    lVar8 = 0;
    uVar11 = 0;
    do {
      uVar4 = uVar11 + 0x3f;
      if (-1 < (long)uVar11) {
        uVar4 = uVar11;
      }
      if (((initial_solution->super__Bvector_base<std::allocator<bool>_>)._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
           [((long)uVar4 >> 6) +
            (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar11 & 0x3f) & 1) == 0) {
        operator-((vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                   *)local_228,&local_148,
                  (vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                   *)((long)&(pvVar7->
                             super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar8));
        pmVar14 = local_148.
                  super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_148.
        super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_218;
        local_148.
        super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_228;
        local_148.
        super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pmStack_220;
        local_228 = (undefined1  [8])0x0;
        pmStack_220 = (pointer)0x0;
        local_218 = (pointer)0x0;
        if (pmVar14 != (pointer)0x0) {
          operator_delete(pmVar14);
        }
        if (local_228 != (undefined1  [8])0x0) {
          operator_delete((void *)local_228);
        }
      }
      uVar11 = uVar11 + 1;
      pvVar7 = (this->M).columns.
               super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x18;
    } while (uVar11 < (ulong)(((long)(this->M).columns.
                                     super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >> 3)
                             * -0x5555555555555555));
  }
  std::
  pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
  ::
  pair<std::vector<bool,_std::allocator<bool>_>_&,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_&,_true>
            ((pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
              *)local_228,initial_solution,&local_148);
  local_198 = (_Rb_tree<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>,std::_Identity<std::vector<bool,std::allocator<bool>>>,std::less<std::vector<bool,std::allocator<bool>>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
               *)&this->explored;
  std::
  _Rb_tree<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>,std::_Identity<std::vector<bool,std::allocator<bool>>>,std::less<std::vector<bool,std::allocator<bool>>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
  ::_M_insert_unique<std::vector<bool,std::allocator<bool>>const&>
            (local_198,(vector<bool,_std::allocator<bool>_> *)local_228);
  std::
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  ::vector(&local_a0,&local_200);
  local_280 = HK<cvs_rk::mod_int<9223372036854775783ul>>(&local_a0);
  if (local_a0.
      super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.
                    super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_1a8 = __return_storage_ptr__;
  std::
  pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
  ::pair(&local_128,
         (pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
          *)local_228);
  local_d8 = &(this->explored)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_190 = 0x800000000000003f;
  local_278 = local_280;
  do {
    do {
      local_1e0 = local_280;
      if ((this->M).columns.
          super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->M).columns.
          super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar11 = 0;
        do {
          local_e8 = uVar11;
          if ((this->M).columns.
              super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (this->M).columns.
              super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar4 = uVar11 + 0x3f;
            if (-1 < (long)uVar11) {
              uVar4 = uVar11;
            }
            lVar8 = (ulong)((uVar11 & local_190) < 0x8000000000000001) * 8 + -8;
            uVar13 = 1L << (uVar11 & 0x3f);
            local_e0 = uVar11 * 0x18;
            lVar10 = 0;
            uVar11 = 0;
            local_1d8 = lVar8;
            do {
              if ((*(ulong *)((long)&((pointer)((long)local_228 + ((long)uVar4 >> 6) * 8))->val +
                             lVar8) & uVar13) == 0) {
                uVar12 = uVar11 + 0x3f;
                if (-1 < (long)uVar11) {
                  uVar12 = uVar11;
                }
                uVar9 = (ulong)((uVar11 & local_190) < 0x8000000000000001);
                lVar8 = local_1d8;
                if ((((pointer)((long)local_228 + (((long)uVar12 >> 6) + (uVar9 - 1)) * 8))->val >>
                     (uVar11 & 0x3f) & 1) != 0) {
                  std::vector<bool,_std::allocator<bool>_>::vector
                            (&local_1d0,(vector<bool,_std::allocator<bool>_> *)local_228);
                  lVar8 = local_1d8;
                  local_268._0_8_ = (_Bit_type *)0x0;
                  local_268._8_8_ = 0;
                  local_268._16_8_ = (_Base_ptr)0x0;
                  local_268._24_8_ = (_Base_ptr)0x0;
                  local_268._32_8_ = (_Base_ptr)0x0;
                  local_268._40_8_ = (pointer)0x0;
                  pmStack_238 = (pointer)0x0;
                  pmStack_230 = (pointer)0x0;
                  puVar1 = (ulong *)((long)local_1d0.super__Bvector_base<std::allocator<bool>_>.
                                           _M_impl.super__Bvector_impl_data._M_start.
                                           super__Bit_iterator_base._M_p +
                                    local_1d8 + ((long)uVar4 >> 6) * 8);
                  *puVar1 = *puVar1 | uVar13;
                  local_1d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                  [((long)uVar12 >> 6) + (uVar9 - 1)] =
                       local_1d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [((long)uVar12 >> 6) + (uVar9 - 1)] & ~(1L << (uVar11 & 0x3f));
                  iVar5 = std::
                          _Rb_tree<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>,_std::_Identity<std::vector<bool,_std::allocator<bool>_>_>,_std::less<std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                          ::find((_Rb_tree<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>,_std::_Identity<std::vector<bool,_std::allocator<bool>_>_>,_std::less<std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                  *)local_198,&local_1d0);
                  if (iVar5._M_node == local_d8) {
                    std::
                    _Rb_tree<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>,std::_Identity<std::vector<bool,std::allocator<bool>>>,std::less<std::vector<bool,std::allocator<bool>>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
                    ::_M_insert_unique<std::vector<bool,std::allocator<bool>>const&>
                              (local_198,&local_1d0);
                    operator+(&local_48,&local_200,
                              (vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                               *)((long)&(((this->M).columns.
                                           super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                                         )._M_impl.super__Vector_impl_data + local_e0));
                    operator-(&local_60,&local_48,
                              (vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                               *)((long)&(((this->M).columns.
                                           super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                                         )._M_impl.super__Vector_impl_data + lVar10));
                    std::
                    pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
                    ::
                    pair<std::vector<bool,_std::allocator<bool>_>_&,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_&,_true>
                              (&local_188,&local_1d0,&local_60);
                    if ((_Bit_type *)local_268._0_8_ != (_Bit_type *)0x0) {
                      operator_delete((void *)local_268._0_8_);
                    }
                    uVar2 = local_268._40_8_;
                    local_268._32_8_ =
                         local_188.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage;
                    local_268._8_8_ =
                         CONCAT44(local_188.first.super__Bvector_base<std::allocator<bool>_>._M_impl
                                  .super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_
                                  ,local_188.first.super__Bvector_base<std::allocator<bool>_>.
                                   _M_impl.super__Bvector_impl_data._M_start.
                                   super__Bit_iterator_base._M_offset);
                    local_268._24_8_ =
                         CONCAT44(local_188.first.super__Bvector_base<std::allocator<bool>_>._M_impl
                                  .super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                  _12_4_,local_188.first.super__Bvector_base<std::allocator<bool>_>.
                                         _M_impl.super__Bvector_impl_data._M_finish.
                                         super__Bit_iterator_base._M_offset);
                    local_268._0_8_ =
                         local_188.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                    local_268._16_8_ =
                         local_188.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
                    local_188.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                         (_Bit_type *)0x0;
                    local_188.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
                    local_188.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
                         (_Bit_type *)0x0;
                    local_188.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
                    local_188.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
                    pmStack_230 = local_188.second.
                                  super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    local_268._40_8_ =
                         local_188.second.
                         super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                    pmStack_238 = local_188.second.
                                  super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish;
                    local_188.second.
                    super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    local_188.second.
                    super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_188.second.
                    super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    if ((pointer)uVar2 != (pointer)0x0) {
                      operator_delete((void *)uVar2);
                    }
                    lVar8 = local_1d8;
                    if (local_188.second.
                        super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_188.second.
                                      super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (local_188.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                        (_Bit_type *)0x0) {
                      operator_delete(local_188.first.super__Bvector_base<std::allocator<bool>_>.
                                      _M_impl.super__Bvector_impl_data._M_start.
                                      super__Bit_iterator_base._M_p);
                      local_188.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                           (_Bit_type *)0x0;
                      local_188.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
                      local_188.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
                           (_Bit_type *)0x0;
                      local_188.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
                      local_188.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
                    }
                    std::
                    vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                    ::vector(&local_b8,
                             (vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                              *)(local_268 + 0x28));
                    local_1a0 = HK<cvs_rk::mod_int<9223372036854775783ul>>(&local_b8);
                    if (local_b8.
                        super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_b8.
                                      super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (local_278 <= local_1a0) {
                      std::vector<bool,_std::allocator<bool>_>::operator=
                                (&local_128.first,(vector<bool,_std::allocator<bool>_> *)local_268);
                      std::
                      vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                      ::operator=(&local_128.second,
                                  (vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                                   *)(local_268 + 0x28));
                      local_278 = local_1a0;
                    }
                    if (local_60.
                        super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_60.
                                      super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (local_48.
                        super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_48.
                                      super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                    }
                  }
                  if ((pointer)local_268._40_8_ != (pointer)0x0) {
                    operator_delete((void *)local_268._40_8_);
                  }
                  if ((_Bit_type *)local_268._0_8_ != (_Bit_type *)0x0) {
                    operator_delete((void *)local_268._0_8_);
                    local_268._0_8_ = (_Bit_type *)0x0;
                    local_268._8_8_ = local_268._8_8_ & 0xffffffff00000000;
                    local_268._16_8_ = (_Base_ptr)0x0;
                    local_268._24_8_ = local_268._24_8_ & 0xffffffff00000000;
                    local_268._32_8_ = (_Base_ptr)0x0;
                  }
                  if (local_1d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                      (_Bit_type *)0x0) {
                    operator_delete(local_1d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)
                    ;
                    local_1d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                         (_Bit_type *)0x0;
                    local_1d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
                    local_1d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
                         (_Bit_type *)0x0;
                    local_1d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
                    local_1d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
                  }
                }
              }
              uVar11 = uVar11 + 1;
              lVar10 = lVar10 + 0x18;
            } while (uVar11 < (ulong)(((long)(this->M).columns.
                                             super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this->M).columns.
                                             super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                     -0x5555555555555555));
          }
          uVar11 = local_e8 + 1;
        } while (uVar11 < (ulong)(((long)(this->M).columns.
                                         super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->M).columns.
                                         super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      local_280 = local_1e0;
      if (local_1e0 < local_278) {
        std::vector<bool,_std::allocator<bool>_>::operator=
                  ((vector<bool,_std::allocator<bool>_> *)local_228,&local_128.first);
        std::
        vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
        ::operator=(&local_200,&local_128.second);
        local_280 = local_278;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Current best solution: H(K) = ",0x1e);
      poVar6 = std::ostream::_M_insert<double>(local_280);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    } while (local_1e0 < local_278);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Local maximum reached. Search terminated.",0x29);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
  } while (local_1e0 < local_278);
  local_268._24_8_ = local_268 + 8;
  local_268._8_8_ = local_268._8_8_ & 0xffffffff00000000;
  local_268._16_8_ = (_Base_ptr)0x0;
  local_268._40_8_ = 0;
  local_268._32_8_ = local_268._24_8_;
  if (local_200.
      super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_200.
      super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pmVar14 = local_200.
              super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_188.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)pmVar14->val;
      std::
      _Rb_tree<cvs_rk::mod_int<9223372036854775783ul>,cvs_rk::mod_int<9223372036854775783ul>,std::_Identity<cvs_rk::mod_int<9223372036854775783ul>>,cvs_rk::local_search::run_fixed_n_all_neighbors(std::vector<bool,std::allocator<bool>>)::{lambda(cvs_rk::mod_int<9223372036854775783ul>,cvs_rk::mod_int<9223372036854775783ul>)#1},std::allocator<cvs_rk::mod_int<9223372036854775783ul>>>
      ::_M_insert_unique<cvs_rk::mod_int<9223372036854775783ul>const&>
                ((_Rb_tree<cvs_rk::mod_int<9223372036854775783ul>,cvs_rk::mod_int<9223372036854775783ul>,std::_Identity<cvs_rk::mod_int<9223372036854775783ul>>,cvs_rk::local_search::run_fixed_n_all_neighbors(std::vector<bool,std::allocator<bool>>)::_lambda(cvs_rk::mod_int<9223372036854775783ul>,cvs_rk::mod_int<9223372036854775783ul>)_1_,std::allocator<cvs_rk::mod_int<9223372036854775783ul>>>
                  *)local_268,(mod_int<9223372036854775783UL> *)&local_188);
      pmVar14 = pmVar14 + 1;
    } while (pmVar14 !=
             local_200.
             super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  psVar3 = local_1a8;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_1a8->B,(vector<bool,_std::allocator<bool>_> *)local_228);
  psVar3->HK = local_280;
  std::
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  ::vector(&local_d0,&local_200);
  dVar15 = H<cvs_rk::mod_int<9223372036854775783ul>>(&local_d0);
  psVar3->H = dVar15;
  psVar3->distinct_rows = local_268._40_4_;
  if (local_d0.
      super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.
                    super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<cvs_rk::mod_int<9223372036854775783UL>,_cvs_rk::mod_int<9223372036854775783UL>,_std::_Identity<cvs_rk::mod_int<9223372036854775783UL>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/nicolaprezza[P]cvs-rk/internal/local_search.hpp:160:15),_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  ::~_Rb_tree((_Rb_tree<cvs_rk::mod_int<9223372036854775783UL>,_cvs_rk::mod_int<9223372036854775783UL>,_std::_Identity<cvs_rk::mod_int<9223372036854775783UL>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_nicolaprezza[P]cvs_rk_internal_local_search_hpp:160:15),_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
               *)local_268);
  if (local_128.second.
      super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.second.
                    super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_128.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_128.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_128.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_128.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    local_128.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_128.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
    local_128.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_200.
      super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_200.
                    super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_228 != (undefined1  [8])0x0) {
    operator_delete((void *)local_228);
    local_228 = (undefined1  [8])0x0;
    pmStack_220 = (pointer)((ulong)pmStack_220 & 0xffffffff00000000);
    local_218 = (pointer)0x0;
    local_210 = 0;
    local_208 = (_Bit_pointer)0x0;
  }
  if (local_148.
      super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return psVar3;
}

Assistant:

search_result run_fixed_n_all_neighbors(vector<bool> initial_solution){

		int N = weight(initial_solution);

		auto hashed_vec = M.hashed_rows();

		for(ulint i=0;i<M.n_columns();++i){

			//remove column from hashed vector
			if(not initial_solution[i]){

				hashed_vec = hashed_vec - M.column(i);

			}

		}

		candidate_t C = {

				initial_solution,
				hashed_vec

		};

		explored.insert(C.first);

		//best H(K): entropy of current solution
		double best_HK = HK<matrix_t::mod_int_t>(C.second);
		double C_HK = best_HK;

		candidate_t best_C = C;

		bool local_max = false;

		//proceed until a local maximum is reached
		while(not local_max){

			//init as true, then check all neighbors
			//if at least 1 neighbor improves the score
			//of C, then local_max = false
			local_max = true;

			//try all neighbors
			//the set of neighbors is built trying all possible O(L^2) combinations
			//of both a flip 0->1 and a flip 1->0
			for(ulint j0 = 0;j0<M.n_columns();++j0){//0->1

				for(ulint j1 = 0;j1<M.n_columns();++j1){//1->0

					if(not C.first[j0] and C.first[j1]){

						auto B = C.first;
						candidate_t new_C;		//neighbor

						B[j0] = true;
						B[j1] = false;

						assert(N==weight(B));

						if(explored.find(B) == explored.end()){

							explored.insert(B);

							auto sum = C.second + M.column(j0);	//sum j0-th column
							auto new_vec = sum-M.column(j1);	//subtract j1-th column

							//new candidate
							new_C = {
									B,
									new_vec
							};

							//compute counts entropy
							double new_HK = HK<matrix_t::mod_int_t>(new_C.second);

							//cout << new_HK << endl;

							if(new_HK>=best_HK){

								best_HK = new_HK;
								best_C = new_C;

							}

						}

					}

				}

			}//end neighbor search cycle

			//if at least 1 neighbor strictly improves
			//C's entropy, then C is not a local maximum
			local_max = best_HK <= C_HK;

			if(not local_max){
				C  = best_C;
				C_HK = best_HK;
			}

			cout << "Current best solution: H(K) = " << C_HK << endl;

			if(local_max){

				cout << "Local maximum reached. Search terminated." << endl;

			}

		}

		auto comp = [](matrix_t::mod_int_t x, matrix_t::mod_int_t y){ return x < y; };
		std::set<matrix_t::mod_int_t,decltype(comp)> distinct_rows(comp);

		for(auto c:C.second) distinct_rows.insert(c);

		return {C.first, C_HK, H<matrix_t::mod_int_t>(C.second), int(distinct_rows.size())};

	}